

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

Fl_Plugin * __thiscall Fl_Plugin_Manager::plugin(Fl_Plugin_Manager *this,char *name)

{
  Node *this_00;
  Node *pNVar1;
  long lVar2;
  Fl_Plugin *pFVar3;
  anon_union_8_2_f9ecdc5e v;
  Fl_Preferences pin;
  char buf [34];
  Fl_Plugin *local_68;
  Fl_Preferences local_60;
  char local_48;
  char acStack_47 [39];
  
  this_00 = (this->super_Fl_Preferences).node;
  pFVar3 = (Fl_Plugin *)0x0;
  pNVar1 = Fl_Preferences::Node::search(this_00,name,0);
  if (pNVar1 != (Node *)0x0) {
    local_60._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
    local_60.rootNode = (this->super_Fl_Preferences).rootNode;
    local_60.node = Fl_Preferences::Node::addChild(this_00,name);
    Fl_Preferences::get(&local_60,"address",&local_48,"",0x22);
    if (local_48 == '@') {
      local_68 = (Fl_Plugin *)0x0;
      lVar2 = 0;
      do {
        *(byte *)((long)&local_68 + lVar2) =
             acStack_47[lVar2 * 2 + 1] + 0xbfU | acStack_47[lVar2 * 2] * '\x10' - 0x10U;
        lVar2 = lVar2 + 1;
        pFVar3 = local_68;
      } while (lVar2 != 8);
    }
    else {
      pFVar3 = (Fl_Plugin *)0x0;
    }
    ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_60);
  }
  return pFVar3;
}

Assistant:

Fl_Plugin *Fl_Plugin_Manager::plugin(const char *name) {
  char buf[34];
  Fl_Plugin *ret = 0;
  if (groupExists(name)) {
    Fl_Preferences pin(this, name);
    pin.get("address", buf, "", 34);
    if (buf[0]=='@') ret = (Fl_Plugin*)a2p(buf+1);
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: returning plugin named \"%s\": (%s) %p\n", name, buf, ret);
#endif
    return ret;
  } else {
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: no plugin found named \"%s\"\n", name);
#endif
    return 0L;
  }
}